

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstrlib.c
# Opt level: O0

int str_sub(lua_State *L)

{
  char *pcVar1;
  lua_Integer lVar2;
  char *local_30;
  ptrdiff_t end;
  ptrdiff_t start;
  char *s;
  size_t l;
  lua_State *L_local;
  
  l = (size_t)L;
  pcVar1 = luaL_checklstring(L,1,(size_t *)&s);
  lVar2 = luaL_checkinteger((lua_State *)l,2);
  end = posrelat(lVar2,(size_t)s);
  lVar2 = luaL_optinteger((lua_State *)l,3,-1);
  local_30 = (char *)posrelat(lVar2,(size_t)s);
  if (end < 1) {
    end = 1;
  }
  if ((long)s < (long)local_30) {
    local_30 = s;
  }
  if ((long)local_30 < end) {
    lua_pushlstring((lua_State *)l,"",0);
  }
  else {
    lua_pushlstring((lua_State *)l,pcVar1 + end + -1,(size_t)(local_30 + (1 - end)));
  }
  return 1;
}

Assistant:

static int str_sub (lua_State *L) {
  size_t l;
  const char *s = luaL_checklstring(L, 1, &l);
  ptrdiff_t start = posrelat(luaL_checkinteger(L, 2), l);
  ptrdiff_t end = posrelat(luaL_optinteger(L, 3, -1), l);
  if (start < 1) start = 1;
  if (end > (ptrdiff_t)l) end = (ptrdiff_t)l;
  if (start <= end)
    lua_pushlstring(L, s+start-1, end-start+1);
  else lua_pushliteral(L, "");
  return 1;
}